

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_typed_array(basic_cbor_encoder<jsoncons::bytes_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *this,span<const_unsigned_char,_18446744073709551615UL> *v,semantic_tag tag,
                   ser_context *context,error_code *ec)

{
  byte *pbVar1;
  byte_string_view local_40;
  
  if ((this->options_).use_typed_arrays_ == true) {
    write_tag(this,(ulong)(tag == clamped) * 4 + 0x40);
    local_40.data_ = v->data_;
    local_40.size_ = v->size_;
    write_byte_string(this,&local_40);
  }
  else {
    (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])(this,v->size_,0);
    if (ec->_M_value == 0) {
      pbVar1 = v->data_;
      do {
        if (pbVar1 == v->data_ + v->size_) {
          (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[8])(this,context,ec);
          return true;
        }
        (*(this->super_basic_json_visitor<char>)._vptr_basic_json_visitor[0xf])
                  (this,(ulong)*pbVar1,tag,context,ec);
        pbVar1 = pbVar1 + 1;
      } while (ec->_M_value == 0);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const uint8_t>& v, 
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        if (options_.use_typed_arrays())
        {
            switch (tag)
            {
                case semantic_tag::clamped:
                    write_tag(0x44);
                    break;
                default:
                    write_tag(0x40);
                    break;
            }
            write_byte_string(byte_string_view(v));
            JSONCONS_VISITOR_RETURN;
        }
        else
        {
            this->begin_array(v.size(), semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            for (auto p = v.begin(); p != v.end(); ++p)
            {
                this->uint64_value(*p, tag, context, ec);
                if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
            }
            this->end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }
    }